

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O2

uint32_t __thiscall
cppnet::BufferQueue::ReadUntil
          (BufferQueue *this,char *res,uint32_t len,char *find,uint32_t find_len,uint32_t *need_len)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar1;
  uint32_t uVar2;
  
  uVar1 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[9])(this,find,(ulong)find_len);
  if (uVar1 != 0) {
    if (uVar1 <= len) {
      UNRECOVERED_JUMPTABLE = (this->super_InnerBuffer).super_Buffer._vptr_Buffer[3];
      uVar2 = (*UNRECOVERED_JUMPTABLE)(this,res,(ulong)uVar1,UNRECOVERED_JUMPTABLE);
      return uVar2;
    }
    *need_len = uVar1;
  }
  return 0;
}

Assistant:

uint32_t BufferQueue::ReadUntil(char* res, uint32_t len, const char* find, uint32_t find_len, uint32_t& need_len) {
    uint32_t size = FindStr(find, find_len);
    if (size) {
        if (size <= len) {
            return Read(res, size);

        } else {
            need_len = size;
            return 0;
        }
    }
    return 0;
}